

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O3

void __thiscall StringTest::Test1(StringTest *this)

{
  int iVar1;
  string t3;
  string t1;
  string t4;
  string t2;
  string t8;
  string t7;
  string t6;
  string t;
  string t5;
  long *local_170;
  long local_168;
  long local_160 [2];
  long *local_150;
  long local_148;
  long local_140 [2];
  long *local_130;
  long local_128;
  long local_120 [2];
  long *local_110;
  long local_108;
  long local_100 [2];
  char *local_f0;
  long local_e8;
  char local_e0;
  undefined7 uStack_df;
  char *local_d0;
  char *local_c8;
  char local_c0;
  undefined7 uStack_bf;
  char *local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  undefined4 local_38;
  undefined1 local_34;
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"this is t1","");
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_150,(long)local_150 + local_148);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"this is t3 ","");
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_170,(long)local_170 + local_168);
  local_40 = 0x2073692073696874;
  local_38 = 0x20203574;
  local_48 = 0xc;
  local_34 = 0;
  local_a8 = 0;
  local_a0 = '\0';
  local_c8 = (char *)0x0;
  local_c0 = '\0';
  local_e8 = 0;
  local_e0 = '\0';
  local_f0 = &local_e0;
  local_d0 = &local_c0;
  local_b0 = &local_a0;
  local_50 = &local_40;
  std::__cxx11::string::_M_replace_aux((ulong)&local_b0,0,0,'\x01');
  std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x1070f6);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"this is t5    ","");
  std::__cxx11::string::assign((string *)&local_f0,(ulong)local_70,5);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_88 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x81,"default contrutor made non-zero sized string");
  }
  if (local_148 == 10) {
    iVar1 = strcmp((char *)local_150,"this is t1");
    if (iVar1 != 0) goto LAB_00103c27;
  }
  else {
LAB_00103c27:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x84,"t1 not correct");
  }
  if (local_108 == 10) {
    iVar1 = strcmp((char *)local_110,"this is t1");
    if (iVar1 != 0) goto LAB_00103c61;
  }
  else {
LAB_00103c61:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x87,"t2 not correct");
  }
  if (local_168 == 0xb) {
    iVar1 = strcmp((char *)local_170,"this is t3 ");
    if (iVar1 != 0) goto LAB_00103c9b;
  }
  else {
LAB_00103c9b:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x8a,"t3 not correct");
  }
  if (local_128 == 0xb) {
    iVar1 = strcmp((char *)local_130,"this is t3 ");
    if (iVar1 != 0) goto LAB_00103cd5;
  }
  else {
LAB_00103cd5:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x8d,"t4 not correct");
  }
  if (local_48 == 0xc) {
    iVar1 = strcmp((char *)local_50,"this is t5  ");
    if (iVar1 != 0) goto LAB_00103d15;
  }
  else {
LAB_00103d15:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x90,"t5 not correct");
  }
  if (((local_a8 != 1) || (*local_b0 != 'a')) || (local_b0[1] != '\0')) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x93,"t6 not correct");
  }
  if (local_c8 == (char *)0x7) {
    iVar1 = strcmp(local_d0,"this is");
    if (iVar1 == 0) goto LAB_00103dad;
  }
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
             ,0x96,"t7 not correct");
LAB_00103dad:
  if (((local_e8 != 2) || (*local_f0 != 'i')) || ((local_f0[1] != 's' || (local_f0[2] != '\0')))) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x99,"t8 not correct");
  }
  TestCase::TestPassed(&this->super_TestCase);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void Test1()
	{
		// test constructors and assignments, requiers that c_str, length and size, be working also.
		string t;
		string t1 = "this is t1";
		string t2 = t1;
		string t3( "this is t3 " );
		string t4( t3 );
		string t5( "this is t5    ", 12 );
		string t6;
		string t7;
		string t8;
		
		t6 = 'a';
		t7.assign( "this is t5    ", 7 );
		t8.assign( "this is t5    ", 5, 2 );
		
		if ( t.length() != 0 || t.size() != 0 )
			TestFailed( "default contrutor made non-zero sized string" );

		if ( t1.length() != 10 || strcmp( t1.c_str(), "this is t1" ) != 0 )
			TestFailed( "t1 not correct" );

		if ( t2.length() != 10 || strcmp( t2.c_str(), "this is t1" ) != 0 )
			TestFailed( "t2 not correct" );

		if ( t3.length() != 11 || strcmp( t3.c_str(), "this is t3 " ) != 0 )
			TestFailed( "t3 not correct" );

		if ( t4.length() != 11 || strcmp( t4.c_str(), "this is t3 " ) != 0 )
			TestFailed( "t4 not correct" );

		if ( t5.length() != 12 || strcmp( t5.c_str(), "this is t5  " ) != 0 )
			TestFailed( "t5 not correct" );

		if ( t6.length() != 1 || strcmp( t6.c_str(), "a" ) != 0 )
			TestFailed( "t6 not correct" );

		if ( t7.length() != 7 || strcmp( t7.c_str(), "this is" ) != 0 )
			TestFailed( "t7 not correct" );
		
		if ( t8.length() != 2 || strcmp( t8.c_str(), "is" ) != 0 )
			TestFailed( "t8 not correct" );

		TestPassed();
	}